

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_mixed_space_gradation(REF_DBL *metric,REF_GRID ref_grid,REF_DBL r,REF_DBL t)

{
  int node_00;
  int node_01;
  uint uVar1;
  REF_STATUS RVar2;
  void *__ptr;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rsb_1;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL phys_space;
  REF_DBL metric_space;
  REF_DBL diag_system [12];
  REF_INT node1;
  REF_INT node0;
  REF_INT edge;
  REF_INT i;
  REF_INT node;
  REF_DBL limited [6];
  REF_DBL limit_metric [6];
  REF_DBL direction [3];
  REF_DBL log_r;
  REF_DBL enlarge;
  REF_DBL ratio;
  REF_DBL dist;
  REF_DBL *metric_orig;
  REF_EDGE ref_edge;
  REF_NODE ref_node;
  REF_DBL t_local;
  REF_DBL r_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  ref_edge = (REF_EDGE)ref_grid->node;
  t_local = r;
  if (r < 1.0) {
    t_local = 1.5;
  }
  if ((t < 0.0) || (ref_node = (REF_NODE)t, t < 1.0)) {
    ref_node = (REF_NODE)0x3fc0000000000000;
  }
  r_local = (REF_DBL)ref_grid;
  ref_grid_local = (REF_GRID)metric;
  dVar3 = log(t_local);
  uVar1 = ref_edge_create((REF_EDGE *)&metric_orig,(REF_GRID)r_local);
  if (uVar1 == 0) {
    if (*(int *)(*(long *)((long)r_local + 8) + 4) * 6 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x341,"ref_metric_mixed_space_gradation","malloc metric_orig of REF_DBL negative");
      metric_local._4_4_ = 1;
    }
    else {
      __ptr = malloc((long)(*(int *)(*(long *)((long)r_local + 8) + 4) * 6) << 3);
      if (__ptr == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x341,"ref_metric_mixed_space_gradation","malloc metric_orig of REF_DBL NULL");
        metric_local._4_4_ = 2;
      }
      else {
        for (edge = 0; edge < *(int *)(*(long *)((long)r_local + 8) + 4); edge = edge + 1) {
          if (((-1 < edge) && (edge < *(int *)(*(long *)((long)r_local + 8) + 4))) &&
             (-1 < *(long *)(*(long *)(*(long *)((long)r_local + 8) + 0x10) + (long)edge * 8))) {
            for (node0 = 0; node0 < 6; node0 = node0 + 1) {
              *(REF_CELL *)((long)__ptr + (long)(node0 + edge * 6) * 8) =
                   ref_grid_local->cell[(long)(node0 + edge * 6) + -2];
            }
          }
        }
        for (node1 = 0; node1 < *(int *)metric_orig; node1 = node1 + 1) {
          node_00 = *(int *)((long)metric_orig[1] + (long)(node1 << 1) * 4);
          node_01 = *(int *)((long)metric_orig[1] + (long)(node1 * 2 + 1) * 4);
          dVar4 = *(double *)(&(ref_edge[1].node)->n + (long)(node_01 * 0xf) * 2) -
                  *(double *)(&(ref_edge[1].node)->n + (long)(node_00 * 0xf) * 2);
          dVar5 = *(double *)(&(ref_edge[1].node)->n + (long)(node_01 * 0xf + 1) * 2) -
                  *(double *)(&(ref_edge[1].node)->n + (long)(node_00 * 0xf + 1) * 2);
          dVar6 = *(double *)(&(ref_edge[1].node)->n + (long)(node_01 * 0xf + 2) * 2) -
                  *(double *)(&(ref_edge[1].node)->n + (long)(node_00 * 0xf + 2) * 2);
          dVar7 = sqrt(dVar6 * dVar6 + dVar4 * dVar4 + dVar5 * dVar5);
          dVar8 = sqrt(dVar6 * (*(double *)((long)__ptr + (long)(node_01 * 6) * 8 + 0x28) * dVar6 +
                               *(double *)((long)__ptr + (long)(node_01 * 6) * 8 + 0x10) * dVar4 +
                               *(double *)((long)__ptr + (long)(node_01 * 6) * 8 + 0x20) * dVar5) +
                       dVar4 * (*(double *)((long)__ptr + (long)(node_01 * 6) * 8 + 0x10) * dVar6 +
                               *(double *)((long)__ptr + (long)(node_01 * 6) * 8) * dVar4 +
                               *(double *)((long)__ptr + (long)(node_01 * 6) * 8 + 8) * dVar5) +
                       dVar5 * (*(double *)((long)__ptr + (long)(node_01 * 6) * 8 + 0x20) * dVar6 +
                               *(double *)((long)__ptr + (long)(node_01 * 6) * 8 + 8) * dVar4 +
                               *(double *)((long)__ptr + (long)(node_01 * 6) * 8 + 0x18) * dVar5));
          uVar1 = ref_matrix_diag_m((REF_DBL *)((long)__ptr + (long)(node_01 * 6) * 8),&metric_space
                                   );
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x358,"ref_metric_mixed_space_gradation",(ulong)uVar1,"decomp");
            ref_metric_show((REF_DBL *)((long)__ptr + (long)(node_01 * 6) * 8));
            return uVar1;
          }
          for (node0 = 0; node0 < 3; node0 = node0 + 1) {
            dVar9 = sqrt(diag_system[(long)node0 + -1]);
            dVar9 = pow(dVar9 * dVar7 * dVar3 + 1.0,(double)ref_node);
            dVar10 = pow(dVar3 * dVar8 + 1.0,1.0 - (double)ref_node);
            dVar9 = pow(dVar9 * dVar10,-2.0);
            diag_system[(long)node0 + -1] = dVar9 * diag_system[(long)node0 + -1];
          }
          uVar1 = ref_matrix_form_m(&metric_space,limited + 5);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x35f,"ref_metric_mixed_space_gradation",(ulong)uVar1,"reform limit");
            return uVar1;
          }
          RVar2 = ref_matrix_intersect
                            ((REF_DBL *)((long)__ptr + (long)(node_00 * 6) * 8),limited + 5,
                             (REF_DBL *)&i);
          if (RVar2 == 0) {
            uVar1 = ref_matrix_intersect
                              ((REF_DBL *)(ref_grid_local->cell + (long)(node_00 * 6) + -2),
                               (REF_DBL *)&i,
                               (REF_DBL *)(ref_grid_local->cell + (long)(node_00 * 6) + -2));
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x365,"ref_metric_mixed_space_gradation",(ulong)uVar1,"update m0");
              return uVar1;
            }
          }
          else {
            ref_node_location((REF_NODE)ref_edge,node_00);
            printf("dist %24.15e ratio %24.15e\n",dVar7,dVar8);
            printf("RECOVER ref_metric_mixed_space_gradation\n");
          }
          dVar4 = sqrt(dVar6 * (*(double *)((long)__ptr + (long)(node_00 * 6) * 8 + 0x28) * dVar6 +
                               *(double *)((long)__ptr + (long)(node_00 * 6) * 8 + 0x10) * dVar4 +
                               *(double *)((long)__ptr + (long)(node_00 * 6) * 8 + 0x20) * dVar5) +
                       dVar4 * (*(double *)((long)__ptr + (long)(node_00 * 6) * 8 + 0x10) * dVar6 +
                               *(double *)((long)__ptr + (long)(node_00 * 6) * 8) * dVar4 +
                               *(double *)((long)__ptr + (long)(node_00 * 6) * 8 + 8) * dVar5) +
                       dVar5 * (*(double *)((long)__ptr + (long)(node_00 * 6) * 8 + 0x20) * dVar6 +
                               *(double *)((long)__ptr + (long)(node_00 * 6) * 8 + 8) * dVar4 +
                               *(double *)((long)__ptr + (long)(node_00 * 6) * 8 + 0x18) * dVar5));
          uVar1 = ref_matrix_diag_m((REF_DBL *)((long)__ptr + (long)(node_00 * 6) * 8),&metric_space
                                   );
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x36f,"ref_metric_mixed_space_gradation",(ulong)uVar1,"decomp");
            ref_metric_show((REF_DBL *)((long)__ptr + (long)(node_00 * 6) * 8));
            return uVar1;
          }
          for (node0 = 0; node0 < 3; node0 = node0 + 1) {
            dVar5 = sqrt(diag_system[(long)node0 + -1]);
            dVar5 = pow(dVar5 * dVar7 * dVar3 + 1.0,(double)ref_node);
            dVar6 = pow(dVar3 * dVar4 + 1.0,1.0 - (double)ref_node);
            dVar5 = pow(dVar5 * dVar6,-2.0);
            diag_system[(long)node0 + -1] = dVar5 * diag_system[(long)node0 + -1];
          }
          uVar1 = ref_matrix_form_m(&metric_space,limited + 5);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x376,"ref_metric_mixed_space_gradation",(ulong)uVar1,"reform limit");
            return uVar1;
          }
          RVar2 = ref_matrix_intersect
                            ((REF_DBL *)((long)__ptr + (long)(node_01 * 6) * 8),limited + 5,
                             (REF_DBL *)&i);
          if (RVar2 == 0) {
            uVar1 = ref_matrix_intersect
                              ((REF_DBL *)(ref_grid_local->cell + (long)(node_01 * 6) + -2),
                               (REF_DBL *)&i,
                               (REF_DBL *)(ref_grid_local->cell + (long)(node_01 * 6) + -2));
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x37c,"ref_metric_mixed_space_gradation",(ulong)uVar1,"update m1");
              return uVar1;
            }
          }
          else {
            ref_node_location((REF_NODE)ref_edge,node_01);
            printf("dist %24.15e ratio %24.15e\n",dVar7,dVar4);
            printf("RECOVER ref_metric_mixed_space_gradation\n");
          }
        }
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        ref_edge_free((REF_EDGE)metric_orig);
        metric_local._4_4_ =
             ref_node_ghost_dbl(*(REF_NODE *)((long)r_local + 8),(REF_DBL *)ref_grid_local,6);
        if (metric_local._4_4_ == 0) {
          metric_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x388,"ref_metric_mixed_space_gradation",(ulong)metric_local._4_4_,"update ghosts")
          ;
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x33f,
           "ref_metric_mixed_space_gradation",(ulong)uVar1,"orig edges");
    metric_local._4_4_ = uVar1;
  }
  return metric_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_mixed_space_gradation(REF_DBL *metric,
                                                    REF_GRID ref_grid,
                                                    REF_DBL r, REF_DBL t) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_DBL *metric_orig;
  REF_DBL dist, ratio, enlarge, log_r;
  REF_DBL direction[3];
  REF_DBL limit_metric[6], limited[6];
  REF_INT node, i;
  REF_INT edge, node0, node1;
  REF_DBL diag_system[12];
  REF_DBL metric_space, phys_space;

  if (r < 1.0) r = 1.5;
  if (t < 0.0 || 1.0 > t) t = 1.0 / 8.0;

  log_r = log(r);

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ref_malloc(metric_orig, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 6; i++) metric_orig[i + 6 * node] = metric[i + 6 * node];
  }

  /* F. Alauzet doi:10.1016/j.finel.2009.06.028
   * 6.2.1. Mixed-space homogeneous gradation */

  each_ref_edge(ref_edge, edge) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    direction[0] =
        (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
    direction[1] =
        (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
    direction[2] =
        (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));
    dist = sqrt(ref_math_dot(direction, direction));

    ratio = ref_matrix_sqrt_vt_m_v(&(metric_orig[6 * node1]), direction);

    RSB(ref_matrix_diag_m(&(metric_orig[6 * node1]), diag_system), "decomp",
        { ref_metric_show(&(metric_orig[6 * node1])); });
    for (i = 0; i < 3; i++) {
      metric_space = 1.0 + log_r * ratio;
      phys_space = 1.0 + sqrt(ref_matrix_eig(diag_system, i)) * dist * log_r;
      enlarge = pow(pow(phys_space, t) * pow(metric_space, 1.0 - t), -2.0);
      ref_matrix_eig(diag_system, i) *= enlarge;
    }
    RSS(ref_matrix_form_m(diag_system, limit_metric), "reform limit");

    if (REF_SUCCESS == ref_matrix_intersect(&(metric_orig[6 * node0]),
                                            limit_metric, limited)) {
      RSS(ref_matrix_intersect(&(metric[6 * node0]), limited,
                               &(metric[6 * node0])),
          "update m0");
    } else {
      ref_node_location(ref_node, node0);
      printf("dist %24.15e ratio %24.15e\n", dist, ratio);
      printf("RECOVER ref_metric_mixed_space_gradation\n");
    }

    ratio = ref_matrix_sqrt_vt_m_v(&(metric_orig[6 * node0]), direction);

    RSB(ref_matrix_diag_m(&(metric_orig[6 * node0]), diag_system), "decomp",
        { ref_metric_show(&(metric_orig[6 * node0])); });
    for (i = 0; i < 3; i++) {
      metric_space = 1.0 + log_r * ratio;
      phys_space = 1.0 + sqrt(ref_matrix_eig(diag_system, i)) * dist * log_r;
      enlarge = pow(pow(phys_space, t) * pow(metric_space, 1.0 - t), -2.0);
      ref_matrix_eig(diag_system, i) *= enlarge;
    }
    RSS(ref_matrix_form_m(diag_system, limit_metric), "reform limit");

    if (REF_SUCCESS == ref_matrix_intersect(&(metric_orig[6 * node1]),
                                            limit_metric, limited)) {
      RSS(ref_matrix_intersect(&(metric[6 * node1]), limited,
                               &(metric[6 * node1])),
          "update m1");
    } else {
      ref_node_location(ref_node, node1);
      printf("dist %24.15e ratio %24.15e\n", dist, ratio);
      printf("RECOVER ref_metric_mixed_space_gradation\n");
    }
  }

  ref_free(metric_orig);

  ref_edge_free(ref_edge);

  RSS(ref_node_ghost_dbl(ref_grid_node(ref_grid), metric, 6), "update ghosts");

  return REF_SUCCESS;
}